

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  byte bVar1;
  BIT_DStream_status BVar2;
  size_t sVar3;
  uint nbBits;
  uint uVar4;
  BIT_DStream_t BStack_70;
  size_t sStack_48;
  undefined1 *puStack_40;
  undefined1 *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar3 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar3;
  }
  if (bmi2 == 0) {
    bVar1 = *(byte *)((long)DTable + 2);
    nbBits = (uint)bVar1;
    sStack_48 = BIT_initDStream(&BStack_70,cSrc,cSrcSize);
    if (sStack_48 < 0xffffffffffffff89) {
      puStack_38 = (undefined1 *)((long)dst + maxDstSize);
      puStack_40 = puStack_38 + -3;
      sStack_48 = maxDstSize;
      while ((BVar2 = BIT_reloadDStream(&BStack_70), dst < puStack_40 &&
             (BVar2 == BIT_DStream_unfinished))) {
        sVar3 = BIT_lookBitsFast(&BStack_70,(uint)bVar1);
        uVar4 = *(byte *)((long)DTable + sVar3 * 2 + 5) + BStack_70.bitsConsumed;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar3 * 2 + 4);
        BStack_70.bitsConsumed = uVar4;
        sVar3 = BIT_lookBitsFast(&BStack_70,(uint)bVar1);
        uVar4 = *(byte *)((long)DTable + sVar3 * 2 + 5) + uVar4;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar3 * 2 + 4);
        BStack_70.bitsConsumed = uVar4;
        sVar3 = BIT_lookBitsFast(&BStack_70,nbBits);
        uVar4 = *(byte *)((long)DTable + sVar3 * 2 + 5) + uVar4;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar3 * 2 + 4);
        BStack_70.bitsConsumed = uVar4;
        sVar3 = BIT_lookBitsFast(&BStack_70,nbBits);
        BStack_70.bitsConsumed = *(byte *)((long)DTable + sVar3 * 2 + 5) + uVar4;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar3 * 2 + 4);
        dst = (void *)((long)dst + 4);
      }
      for (; uVar4 = BStack_70.bitsConsumed, dst < puStack_38; dst = (void *)((long)dst + 1)) {
        sVar3 = BIT_lookBitsFast(&BStack_70,nbBits);
        BStack_70.bitsConsumed = uVar4 + *(byte *)((long)DTable + sVar3 * 2 + 5);
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar3 * 2 + 4);
      }
      if (BStack_70.ptr != BStack_70.start) {
        sStack_48 = 0xffffffffffffffec;
      }
      if (BStack_70.bitsConsumed != 0x40) {
        sStack_48 = 0xffffffffffffffec;
      }
    }
    return sStack_48;
  }
  sVar3 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
  return sVar3;
}

Assistant:

size_t HUF_decompress1X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}